

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,int iter,
               realtype *R,realtype *gamma)

{
  double dVar1;
  realtype *c_00;
  N_Vector *X;
  int *piVar2;
  int iVar3;
  realtype rVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  N_Vector *Xv;
  realtype *cv;
  int nvec;
  realtype s;
  realtype c;
  realtype temp;
  realtype b;
  realtype a;
  realtype alfa;
  int *ipt_map;
  int retval;
  int lAA;
  int j;
  int i;
  int i_pt;
  int iter_local;
  N_Vector xold_local;
  N_Vector x_local;
  N_Vector fv_local;
  N_Vector gval_local;
  KINMem kin_mem_local;
  
  c_00 = kin_mem->kin_cv;
  X = kin_mem->kin_Xv;
  piVar2 = kin_mem->kin_ipt_map;
  iVar3 = (iter + -1) - (int)((long)(iter + -1) / kin_mem->kin_m_aa) * (int)kin_mem->kin_m_aa;
  N_VLinearSum(1.0,gval,-1.0,xold,fv);
  if (0 < iter) {
    N_VLinearSum(1.0,gval,-1.0,kin_mem->kin_gold_aa,kin_mem->kin_dg_aa[iVar3]);
    N_VLinearSum(1.0,fv,-1.0,kin_mem->kin_fold_aa,kin_mem->kin_df_aa[iVar3]);
  }
  N_VScale(1.0,gval,kin_mem->kin_gold_aa);
  N_VScale(1.0,fv,kin_mem->kin_fold_aa);
  if (iter == 0) {
    N_VScale(1.0,gval,x);
  }
  else {
    if (iter == 1) {
      rVar4 = N_VDotProd(kin_mem->kin_df_aa[iVar3],kin_mem->kin_df_aa[iVar3]);
      dVar5 = sqrt(rVar4);
      *R = dVar5;
      N_VScale(1.0 / *R,kin_mem->kin_df_aa[iVar3],kin_mem->kin_q_aa[iVar3]);
      *piVar2 = 0;
    }
    else if (kin_mem->kin_m_aa < (long)iter) {
      for (lAA = 0; (long)lAA < kin_mem->kin_m_aa + -1; lAA = lAA + 1) {
        dVar5 = R[(long)(lAA + 1) * kin_mem->kin_m_aa + (long)lAA];
        dVar7 = R[(long)(lAA + 1) * kin_mem->kin_m_aa + (long)lAA + 1];
        dVar6 = sqrt(dVar5 * dVar5 + dVar7 * dVar7);
        dVar5 = dVar5 / dVar6;
        dVar7 = dVar7 / dVar6;
        R[(long)(lAA + 1) * kin_mem->kin_m_aa + (long)lAA] = dVar6;
        R[(long)(lAA + 1) * kin_mem->kin_m_aa + (long)lAA + 1] = 0.0;
        if ((long)lAA < kin_mem->kin_m_aa + -1) {
          for (retval = lAA + 2; (long)retval < kin_mem->kin_m_aa; retval = retval + 1) {
            dVar6 = R[(long)retval * kin_mem->kin_m_aa + (long)lAA];
            dVar1 = R[(long)retval * kin_mem->kin_m_aa + (long)lAA + 1];
            R[(long)retval * kin_mem->kin_m_aa + (long)lAA + 1] = -dVar7 * dVar6 + dVar5 * dVar1;
            R[(long)retval * kin_mem->kin_m_aa + (long)lAA] = dVar5 * dVar6 + dVar7 * dVar1;
          }
        }
        N_VLinearSum(dVar5,kin_mem->kin_q_aa[lAA],dVar7,kin_mem->kin_q_aa[lAA + 1],
                     kin_mem->kin_vtemp2);
        N_VLinearSum(-dVar7,kin_mem->kin_q_aa[lAA],dVar5,kin_mem->kin_q_aa[lAA + 1],
                     kin_mem->kin_q_aa[lAA + 1]);
        N_VScale(1.0,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lAA]);
      }
      for (lAA = 1; (long)lAA < kin_mem->kin_m_aa; lAA = lAA + 1) {
        for (retval = 0; (long)retval < kin_mem->kin_m_aa + -1; retval = retval + 1) {
          R[(long)(lAA + -1) * kin_mem->kin_m_aa + (long)retval] =
               R[(long)lAA * kin_mem->kin_m_aa + (long)retval];
        }
      }
      N_VScale(1.0,kin_mem->kin_df_aa[iVar3],kin_mem->kin_vtemp2);
      for (retval = 0; (long)retval < kin_mem->kin_m_aa + -1; retval = retval + 1) {
        rVar4 = N_VDotProd(kin_mem->kin_q_aa[retval],kin_mem->kin_vtemp2);
        R[(kin_mem->kin_m_aa + -1) * kin_mem->kin_m_aa + (long)retval] = rVar4;
        N_VLinearSum(1.0,kin_mem->kin_vtemp2,
                     -R[(kin_mem->kin_m_aa + -1) * kin_mem->kin_m_aa + (long)retval],
                     kin_mem->kin_q_aa[retval],kin_mem->kin_vtemp2);
      }
      rVar4 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      dVar5 = sqrt(rVar4);
      R[(kin_mem->kin_m_aa + -1) * kin_mem->kin_m_aa + kin_mem->kin_m_aa + -1] = dVar5;
      N_VScale(1.0 / R[(kin_mem->kin_m_aa + -1) * kin_mem->kin_m_aa + kin_mem->kin_m_aa + -1],
               kin_mem->kin_vtemp2,kin_mem->kin_q_aa[kin_mem->kin_m_aa + -1]);
      retval = 0;
      lAA = iVar3;
      while (lAA = lAA + 1, (long)lAA < kin_mem->kin_m_aa) {
        piVar2[retval] = lAA;
        retval = retval + 1;
      }
      for (lAA = 0; lAA < iVar3 + 1; lAA = lAA + 1) {
        piVar2[retval] = lAA;
        retval = retval + 1;
      }
    }
    else {
      N_VScale(1.0,kin_mem->kin_df_aa[iVar3],kin_mem->kin_vtemp2);
      for (retval = 0; retval < iter + -1; retval = retval + 1) {
        piVar2[retval] = retval;
        rVar4 = N_VDotProd(kin_mem->kin_q_aa[retval],kin_mem->kin_vtemp2);
        R[(long)(iter + -1) * kin_mem->kin_m_aa + (long)retval] = rVar4;
        N_VLinearSum(1.0,kin_mem->kin_vtemp2,
                     -R[(long)(iter + -1) * kin_mem->kin_m_aa + (long)retval],
                     kin_mem->kin_q_aa[retval],kin_mem->kin_vtemp2);
      }
      rVar4 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      dVar5 = sqrt(rVar4);
      R[(long)(iter + -1) * kin_mem->kin_m_aa + (long)iter + -1] = dVar5;
      N_VScale(1.0 / R[(long)(iter + -1) * kin_mem->kin_m_aa + (long)iter + -1],kin_mem->kin_vtemp2,
               kin_mem->kin_q_aa[iVar3]);
      piVar2[iter + -1] = iter + -1;
    }
    ipt_map._4_4_ = iter;
    if (kin_mem->kin_m_aa < (long)iter) {
      ipt_map._4_4_ = (int)kin_mem->kin_m_aa;
    }
    iVar3 = N_VDotProdMulti(ipt_map._4_4_,fv,kin_mem->kin_q_aa,gamma);
    if (iVar3 != 0) {
      return -0x10;
    }
    *c_00 = 1.0;
    *X = gval;
    cv._4_4_ = 1;
    retval = ipt_map._4_4_;
    while (lAA = retval + -1, -1 < lAA) {
      for (; retval < ipt_map._4_4_; retval = retval + 1) {
        gamma[lAA] = -R[(long)retval * kin_mem->kin_m_aa + (long)lAA] * gamma[retval] + gamma[lAA];
      }
      gamma[lAA] = gamma[lAA] / R[(long)lAA * kin_mem->kin_m_aa + (long)lAA];
      c_00[cv._4_4_] = -gamma[lAA];
      X[cv._4_4_] = kin_mem->kin_dg_aa[piVar2[lAA]];
      cv._4_4_ = cv._4_4_ + 1;
      retval = lAA;
    }
    iVar3 = N_VLinearCombination(cv._4_4_,c_00,X,x);
    if (iVar3 != 0) {
      return -0x10;
    }
  }
  return 0;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, 
		       N_Vector x, N_Vector xold, 
		       int iter, realtype *R, realtype *gamma)
{
  int i_pt, i, j, lAA, retval;
  int *ipt_map;
  realtype alfa;
  realtype a, b, temp, c, s;

  /* local shortcuts for fused vector operation */
  int       nvec=0;
  realtype* cv=kin_mem->kin_cv;
  N_Vector* Xv=kin_mem->kin_Xv;

  ipt_map = kin_mem->kin_ipt_map;
  i_pt = iter-1 - ((iter-1)/kin_mem->kin_m_aa)*kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -1.0, xold, fv);
  if (iter > 0) {
    /* compute dg_new = gval -gval_old*/
    N_VLinearSum(ONE, gval, -1.0, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -1.0, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  if (iter == 0) {
    N_VScale(ONE, gval, x);
  }
  else {
    if (iter == 1) {
      R[0] = sqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
      alfa = 1/R[0];
      N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
      ipt_map[0] = 0;
    }
    else if (iter <= kin_mem->kin_m_aa) {
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (iter-1); j++) {
        ipt_map[j] = j;
        R[(iter-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE,kin_mem->kin_vtemp2, -R[(iter-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
      }
      R[(iter-1)*kin_mem->kin_m_aa+iter-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(iter-1)*kin_mem->kin_m_aa+iter-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i_pt]);
      ipt_map[iter-1] = iter-1;
    }
    else {
      /* Delete left-most column vector from QR factorization */
      for (i=0; i < kin_mem->kin_m_aa-1; i++) {
        a = R[(i+1)*kin_mem->kin_m_aa + i];
        b = R[(i+1)*kin_mem->kin_m_aa + i+1];
        temp = sqrt(a*a + b*b);
        c = a / temp;
        s = b / temp;
        R[(i+1)*kin_mem->kin_m_aa + i] = temp;
        R[(i+1)*kin_mem->kin_m_aa + i+1] = 0.0;
	/* OK to re-use temp */
        if (i < kin_mem->kin_m_aa-1) {
          for (j = i+2; j < kin_mem->kin_m_aa; j++) {
            a = R[j*kin_mem->kin_m_aa + i];
            b = R[j*kin_mem->kin_m_aa + i+1];
            temp = c * a + s * b;
            R[j*kin_mem->kin_m_aa + i+1] = -s*a + c*b;
            R[j*kin_mem->kin_m_aa + i] = temp;
	  }
	}
        N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i+1], kin_mem->kin_vtemp2);
        N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i+1], kin_mem->kin_q_aa[i+1]);
        N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
      }

      /* Shift R to the left by one. */
      for (i = 1; i < kin_mem->kin_m_aa; i++) {
        for (j = 0; j < kin_mem->kin_m_aa-1; j++) {
          R[(i-1)*kin_mem->kin_m_aa + j] = R[i*kin_mem->kin_m_aa + j];
        }
      }

      /* Add the new df vector */
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (kin_mem->kin_m_aa-1); j++) {
        R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE, kin_mem->kin_vtemp2, -R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j],kin_mem->kin_vtemp2);
      }
      R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[kin_mem->kin_m_aa-1]);

      /* Update the iteration map */
      j = 0;
      for (i=i_pt+1; i < kin_mem->kin_m_aa; i++)
        ipt_map[j++] = i;
      for (i=0; i < (i_pt+1); i++)
        ipt_map[j++] = i;
    }

    /* Solve least squares problem and update solution */
    lAA = iter;
    if (kin_mem->kin_m_aa < iter) lAA = kin_mem->kin_m_aa;

    retval = N_VDotProdMulti(lAA, fv, kin_mem->kin_q_aa, gamma);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

    /* set arrays for fused vector operation */
    cv[0] = ONE;
    Xv[0] = gval;
    nvec = 1;

    for (i=lAA-1; i > -1; i--) {
      for (j=i+1; j < lAA; j++) {
        gamma[i] = gamma[i]-R[j*kin_mem->kin_m_aa+i]*gamma[j]; 
      }
      gamma[i] = gamma[i]/R[i*kin_mem->kin_m_aa+i];

      cv[nvec] = -gamma[i];
      Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
      nvec += 1;
    }

    /* update solution */
    retval = N_VLinearCombination(nvec, cv, Xv, x);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

  }

  return 0;
}